

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O2

void __thiscall
sznet::WeakCallback<sznet::net::KcpConnection>::operator()
          (WeakCallback<sznet::net::KcpConnection> *this)

{
  undefined1 local_28 [8];
  shared_ptr<sznet::net::KcpConnection> ptr;
  
  std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)local_28,this);
  if (local_28 != (undefined1  [8])0x0) {
    std::function<void_(sznet::net::KcpConnection_*)>::operator()
              (&this->m_function,(KcpConnection *)local_28);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr);
  return;
}

Assistant:

void operator()(ARGS&&... args) const
	{
		// �����Ƿ�����
		std::shared_ptr<CLASS> ptr(m_object.lock());
		if (ptr)
		{
			// û�п����͵��ûص�����
			m_function(ptr.get(), std::forward<ARGS>(args)...);
		}
		// else
		// {
		//   LOG_TRACE << "expired";
		// }
	}